

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void store_number(char *dest,uint number)

{
  int iVar1;
  size_t sVar2;
  uint local_18;
  uint digit;
  uint i;
  uint number_local;
  char *dest_local;
  
  sVar2 = strlen(dest);
  iVar1 = num_length(number);
  local_18 = (int)sVar2 + iVar1;
  dest[local_18] = '\0';
  digit = number;
  if (number == 0) {
    dest[local_18 - 1] = '0';
    local_18 = local_18 - 2;
  }
  else {
    for (; local_18 = local_18 - 1, digit != 0; digit = digit / 10) {
      dest[local_18] = (char)(digit % 10) + '0';
    }
  }
  dest[local_18] = '_';
  return;
}

Assistant:

void
store_number(char *dest, unsigned number)
{
  unsigned i = strlen(dest) + num_length(number);
  dest[i] = '\0';
  if (number) {
    --i;
    while (number > 0) {
      unsigned digit = number % 10;
      dest[i] = '0' + digit;
      number /= 10;
      --i;
    }
  } else {
    dest[i - 1] = '0';
    i -= 2;
  }
  dest[i] = '_';
}